

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL GetFileInformationByHandle(HANDLE hFile,LPBY_HANDLE_FILE_INFORMATION lpFileInformation)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  BOOL BVar3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  FILETIME FVar7;
  undefined1 local_d8 [8];
  stat stat_data;
  undefined8 *puStack_40;
  DWORD dwAttr;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  DWORD dwLastError;
  BOOL bRet;
  CPalThread *pThread;
  LPBY_HANDLE_FILE_INFORMATION lpFileInformation_local;
  HANDLE hFile_local;
  
  pFileObject._4_4_ = 0;
  pFileObject._0_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  puStack_40 = (undefined8 *)0x0;
  stat_data.__glibc_reserved[2]._4_4_ = 0;
  pThread = (CPalThread *)lpFileInformation;
  lpFileInformation_local = (LPBY_HANDLE_FILE_INFORMATION)hFile;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  _dwLastError = CorUnix::InternalGetCurrentThread();
  if (lpFileInformation_local == (LPBY_HANDLE_FILE_INFORMATION)&DAT_ffffffffffffffff) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pFileObject._0_4_ = 6;
  }
  else {
    pFileObject._0_4_ =
         (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                   (CorUnix::g_pObjectManager,_dwLastError,lpFileInformation_local,CorUnix::aotFile,
                    0x80000000,&pLocalData);
    if (((DWORD)pFileObject == 0) &&
       (pFileObject._0_4_ =
             (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                       (pLocalData,_dwLastError,0,&stack0xffffffffffffffc0,&pLocalDataLock),
       (DWORD)pFileObject == 0)) {
      iVar2 = fstat64(*(int *)&pLocalDataLock[1]._vptr_IDataLock,(stat64 *)local_d8);
      if (iVar2 == 0) {
        if (((uint)stat_data.st_nlink & 0xf000) == 0x4000) {
          stat_data.__glibc_reserved[2]._4_4_ = stat_data.__glibc_reserved[2]._4_4_ | 0x10;
        }
        else if (((uint)stat_data.st_nlink & 0xf000) != 0x8000) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pFileObject._0_4_ = 5;
          goto LAB_00142cf4;
        }
        BVar3 = UTIL_IsReadOnlyBitsSet((stat *)local_d8);
        if (BVar3 != 0) {
          stat_data.__glibc_reserved[2]._4_4_ = stat_data.__glibc_reserved[2]._4_4_ | 1;
        }
        if (stat_data.__glibc_reserved[2]._4_4_ == 0) {
          stat_data.__glibc_reserved[2]._4_4_ = 0x80;
        }
        *(uint *)&pThread->_vptr_CPalThread = stat_data.__glibc_reserved[2]._4_4_;
        FVar7 = FILEUnixTimeToFileTime(stat_data.st_mtim.tv_nsec,0);
        *(FILETIME *)((long)&pThread->_vptr_CPalThread + 4) = FVar7;
        FVar7 = FILEUnixTimeToFileTime(stat_data.st_blocks,0);
        *(FILETIME *)((long)&pThread->m_pNext + 4) = FVar7;
        FVar7 = FILEUnixTimeToFileTime(stat_data.st_atim.tv_nsec,0);
        *(FILETIME *)&pThread->m_fExitCodeSet = FVar7;
        *(undefined4 *)((long)&(pThread->m_csLock).DebugInfo + 4) = local_d8._0_4_;
        (pThread->m_csLock).RecursionCount = (LONG)stat_data.st_rdev;
        (pThread->m_csLock).LockCount = (LONG)(stat_data.st_rdev >> 0x20);
        *(undefined4 *)&(pThread->m_csLock).OwningThread = (undefined4)stat_data.st_ino;
        *(undefined4 *)((long)&(pThread->m_csLock).OwningThread + 4) = 0;
        *(undefined4 *)&(pThread->m_csLock).LockSemaphore = (undefined4)stat_data.st_dev;
        pFileObject._4_4_ = 1;
      }
      else {
        pFileObject._0_4_ = FILEGetLastErrorFromErrno();
        if ((DWORD)pFileObject == 0x54f) {
          fprintf(_stderr,"] %s %s:%d","GetFileInformationByHandle",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                  ,0x1378);
          __stream = _stderr;
          puVar4 = (uint *)__errno_location();
          uVar1 = *puVar4;
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          fprintf(__stream,"fstat() not expected to fail with errno:%d (%s)\n",(ulong)uVar1,pcVar6);
        }
      }
    }
  }
LAB_00142cf4:
  if (puStack_40 != (undefined8 *)0x0) {
    (**(code **)*puStack_40)(puStack_40,_dwLastError,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,_dwLastError);
  }
  if ((DWORD)pFileObject != 0) {
    CorUnix::CPalThread::SetLastError((DWORD)pFileObject);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pFileObject._4_4_;
  }
  abort();
}

Assistant:

BOOL
PALAPI
GetFileInformationByHandle(
             IN HANDLE hFile,
             OUT LPBY_HANDLE_FILE_INFORMATION lpFileInformation)
{
    CPalThread *pThread;
    BOOL bRet = FALSE;
    DWORD dwLastError = 0;

    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    DWORD dwAttr = 0;
    struct stat stat_data;

    PERF_ENTRY(GetFileInformationByHandle);
    ENTRY("GetFileInformationByHandle(hFile=%p, lpFileInformation=%p)\n",
          hFile, lpFileInformation);

    pThread = InternalGetCurrentThread();

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        dwLastError = ERROR_INVALID_HANDLE;
        goto done;
    }

    dwLastError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != dwLastError)
    {
        goto done;
    }
    
    dwLastError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != dwLastError)
    {
        goto done;
    }

    if ( fstat(pLocalData->unix_fd, &stat_data) != 0 )
    {
        if ((dwLastError = FILEGetLastErrorFromErrno()) == ERROR_INTERNAL_ERROR)
        {
            ASSERT("fstat() not expected to fail with errno:%d (%s)\n",
                   errno, strerror(errno));
        }
        goto done;
    }

    if ( (stat_data.st_mode & S_IFMT) == S_IFDIR )
    {
        dwAttr |= FILE_ATTRIBUTE_DIRECTORY;
    }
    else if ( (stat_data.st_mode & S_IFMT) != S_IFREG )
    {
        ERROR("Not a regular file or directory, S_IFMT is %#x\n", 
              stat_data.st_mode & S_IFMT);
        dwLastError = ERROR_ACCESS_DENIED;
        goto done;
    }

    if ( UTIL_IsReadOnlyBitsSet( &stat_data ) )
    {
        dwAttr |= FILE_ATTRIBUTE_READONLY;
    }

    /* finally, if nothing is set... */
    if ( dwAttr == 0 )
    {
        dwAttr = FILE_ATTRIBUTE_NORMAL;
    }

    lpFileInformation->dwFileAttributes = dwAttr;

    /* get the file times */
    lpFileInformation->ftCreationTime =
        FILEUnixTimeToFileTime( stat_data.st_ctime,
                                ST_CTIME_NSEC(&stat_data) );
    lpFileInformation->ftLastAccessTime =
        FILEUnixTimeToFileTime( stat_data.st_atime,
                                ST_ATIME_NSEC(&stat_data) );
    lpFileInformation->ftLastWriteTime =
        FILEUnixTimeToFileTime( stat_data.st_mtime,
                                ST_MTIME_NSEC(&stat_data) );

    lpFileInformation->dwVolumeSerialNumber = stat_data.st_dev;

    /* Get the file size. GetFileSize is not used because it gets the
       size of an already-open file */
    lpFileInformation->nFileSizeLow = (DWORD) stat_data.st_size;
#if SIZEOF_OFF_T > 4
    lpFileInformation->nFileSizeHigh = (DWORD)(stat_data.st_size >> 32);
#else
    lpFileInformation->nFileSizeHigh = 0;
#endif

    lpFileInformation->nNumberOfLinks = stat_data.st_nlink;
    lpFileInformation->nFileIndexHigh = 0;
    lpFileInformation->nFileIndexLow = stat_data.st_ino;

    bRet = TRUE;

done:
    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (dwLastError) pThread->SetLastError(dwLastError);

    LOGEXIT("GetFileInformationByHandle returns BOOL %d\n", bRet);
    PERF_EXIT(GetFileInformationByHandle);
    return bRet;
}